

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void DDecalStretcher::InPlaceConstructor(void *mem)

{
  DDecalStretcher *this;
  void *mem_local;
  
  this = (DDecalStretcher *)DObject::operator_new(0x70,(EInPlace *)mem);
  DDecalStretcher(this);
  return;
}

Assistant:

void DDecalStretcher::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("starttime", TimeToStart)
		("endtime", TimeToStop)
		("goalx", GoalX)
		("startx", StartX)
		("stretchx", bStretchX)
		("goaly", GoalY)
		("starty", StartY)
		("stretchy", bStretchY)
		("started", bStarted);
}